

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void add_zero_pad(double *X,int rows,int cols,int zrow,int zcol,double *Y)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  
  iVar1 = zcol + cols;
  if (0 < rows) {
    iVar3 = cols + 1;
    if (cols + 1 < iVar1) {
      iVar3 = iVar1;
    }
    uVar6 = 0;
    pdVar4 = Y;
    do {
      if (0 < cols) {
        uVar2 = 0;
        do {
          pdVar4[uVar2] = X[uVar2];
          uVar2 = uVar2 + 1;
        } while ((uint)cols != uVar2);
      }
      if (0 < zcol) {
        memset(Y + (iVar1 * (int)uVar6 + cols),0,(ulong)(uint)(~cols + iVar3) * 8 + 8);
      }
      uVar6 = uVar6 + 1;
      pdVar4 = pdVar4 + iVar1;
      X = X + cols;
    } while (uVar6 != (uint)rows);
  }
  if (0 < zrow) {
    iVar5 = zrow + rows;
    iVar3 = rows * iVar1;
    do {
      if (0 < iVar1) {
        memset(Y + iVar3,0,(ulong)((zcol + cols) - 1) * 8 + 8);
      }
      rows = rows + 1;
      iVar3 = iVar3 + iVar1;
    } while (rows < iVar5);
  }
  return;
}

Assistant:

void add_zero_pad(double *X, int rows, int cols, int zrow, int zcol,double *Y) {
	int r,c,i,j,u,v;
	r = rows + zrow;
	c = cols + zcol;
	
	for (i = 0; i < rows;++i) {
		u = i*c;
		v = i * cols;
		for (j = 0; j < cols;++j) {
			Y[u + j] = X[v + j];
		}
		for (j = cols; j < c;++j) {
			Y[u + j] = 0.;
		}
	}
	
	for (i = rows; i < r;++i) {
		u = i*c;
		for(j = 0; j < c;++j) {
			Y[u + j] = 0.;
		}
	}
	
}